

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring.hxx
# Opt level: O1

double * __thiscall Ring<double>::operator[](Ring<double> *this,int *index)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if ((this->ringDelayedAdd != 0.0) || (NAN(this->ringDelayedAdd))) {
    iVar1 = this->ringSize;
    if (0 < (long)iVar1) {
      pdVar2 = this->ringData;
      lVar6 = 0;
      do {
        pdVar2[lVar6] = this->ringDelayedAdd + pdVar2[lVar6];
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
    this->ringDelayedAdd = 0.0;
  }
  iVar1 = this->ringSize;
  iVar4 = this->ringCurrentIndex + iVar1 + *index;
  iVar5 = -(*index + this->ringCurrentIndex + iVar1);
  do {
    iVar4 = iVar4 - iVar1;
    iVar5 = iVar5 + iVar1;
  } while (iVar1 <= iVar4);
  iVar3 = 0;
  if (0 < iVar4) {
    iVar3 = iVar4;
  }
  return this->ringData +
         ((((iVar3 - (uint)(iVar3 != iVar4)) + iVar5) / (iVar1 + (uint)(iVar1 == 0)) +
          (uint)(iVar3 != iVar4)) * iVar1 + iVar4);
}

Assistant:

void flush() const {
        if (ringDelayedAdd != 0.0) {
            for(int i=0; i<ringSize; i++) {
                ringData[i] += ringDelayedAdd;
            }
            ringDelayedAdd = 0.0;
        }
    }